

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_promise_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSRuntime *pJVar1;
  JSValue new_target_00;
  JSValue v;
  JSValue func_obj;
  JSValue v_00;
  int iVar2;
  JSValueUnion JVar3;
  undefined4 *puVar4;
  ulong uVar5;
  JSValueUnion JVar6;
  undefined4 *puVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  JSValue v_01;
  JSValue v_02;
  JSValue JVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue args [2];
  JSValue error;
  JSValueUnion local_88;
  JSValueUnion local_78;
  int64_t local_70;
  JSValueUnion local_68;
  int64_t local_60;
  JSValueUnion local_50;
  JSValueUnion local_48;
  int64_t iStack_40;
  
  JVar13 = *argv;
  iVar2 = check_function(ctx,*argv);
  if (iVar2 == 0) {
    JVar11 = js_create_from_ctor(ctx,new_target,0x2a);
    uVar10 = JVar11.tag;
    JVar3 = JVar11.u;
    if ((uVar10 & 0xffffffff) != 6) {
      puVar4 = (undefined4 *)js_mallocz(ctx,0x40);
      if (puVar4 != (undefined4 *)0x0) {
        *puVar4 = 0;
        puVar4[10] = 0;
        puVar7 = puVar4 + 2;
        lVar9 = 1;
        do {
          *(undefined4 **)puVar7 = puVar7;
          *(undefined4 **)(puVar7 + 2) = puVar7;
          puVar7 = puVar7 + 4;
          lVar9 = lVar9 + -1;
        } while (lVar9 == 0);
        puVar4[0xc] = 0;
        *(undefined8 *)(puVar4 + 0xe) = 3;
        if ((uint)JVar11.tag == 0xffffffff) {
          *(undefined4 **)((long)JVar3.ptr + 0x30) = puVar4;
        }
        local_78 = JVar3;
        iVar2 = js_create_resolving_functions(ctx,(JSValue *)&local_78,JVar11);
        if (iVar2 == 0) {
          uVar5 = (ulong)local_88 >> 0x20;
          local_88.ptr = (void *)(uVar5 << 0x20);
          JVar14.tag = 3;
          JVar14.u.ptr = local_88.ptr;
          JVar13 = JS_CallInternal(ctx,JVar13,(JSValue)(ZEXT816(3) << 0x40),JVar14,2,
                                   (JSValue *)&local_78,2);
          JVar6 = JVar13.u;
          if ((uint)JVar13.tag == 6) {
            pJVar1 = ctx->rt;
            local_48 = (JSValueUnion)(pJVar1->current_exception).u.ptr;
            iStack_40 = (pJVar1->current_exception).tag;
            (pJVar1->current_exception).u.int32 = 0;
            (pJVar1->current_exception).tag = 2;
            func_obj.tag = local_60;
            func_obj.u.ptr = local_68.ptr;
            local_88.ptr = (void *)(uVar5 << 0x20);
            new_target_00.tag = 3;
            new_target_00.u.ptr = local_88.ptr;
            local_50 = JVar13.u;
            JVar14 = JS_CallInternal(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),new_target_00,1,
                                     (JSValue *)&local_48,2);
            if ((0xfffffff4 < (uint)iStack_40) &&
               (iVar2 = *local_48.ptr, *(int *)local_48.ptr = iVar2 + -1, iVar2 < 2)) {
              v_01.tag = iStack_40;
              v_01.u.ptr = local_48.ptr;
              __JS_FreeValueRT(ctx->rt,v_01);
            }
            iVar2 = 6;
            if ((int)JVar14.tag != 6) {
              JS_FreeValue(ctx,JVar14);
              iVar2 = 0;
            }
            if (iVar2 == 6) {
              v.tag = local_70;
              v.u.ptr = local_78.ptr;
              JS_FreeValue(ctx,v);
              v_00.tag = local_60;
              v_00.u.ptr = local_68.ptr;
              JS_FreeValue(ctx,v_00);
              goto LAB_0013154d;
            }
            JVar6 = local_50;
            if (iVar2 != 0) {
              uVar5 = 0;
              uVar8 = 0;
              goto LAB_00131582;
            }
          }
          if ((0xfffffff4 < (uint)JVar13.tag) &&
             (iVar2 = *JVar6.ptr, *(int *)JVar6.ptr = iVar2 + -1, iVar2 < 2)) {
            JVar13.u.ptr = JVar6.ptr;
            __JS_FreeValueRT(ctx->rt,JVar13);
          }
          if ((0xfffffff4 < (uint)local_70) &&
             (iVar2 = *local_78.ptr, *(int *)local_78.ptr = iVar2 + -1, iVar2 < 2)) {
            JVar11.tag = local_70;
            JVar11.u.ptr = local_78.ptr;
            __JS_FreeValueRT(ctx->rt,JVar11);
          }
          if ((0xfffffff4 < (uint)local_60) &&
             (iVar2 = *local_68.ptr, *(int *)local_68.ptr = iVar2 + -1, iVar2 < 2)) {
            v_02.tag = local_60;
            v_02.u.ptr = local_68.ptr;
            __JS_FreeValueRT(ctx->rt,v_02);
          }
          uVar8 = (ulong)JVar3.ptr & 0xffffffff00000000;
          uVar5 = (ulong)JVar3.ptr & 0xffffffff;
          goto LAB_00131582;
        }
      }
LAB_0013154d:
      if ((0xfffffff4 < (uint)JVar11.tag) &&
         (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar11);
      }
    }
  }
  uVar5 = 0;
  uVar8 = 0;
  uVar10 = 6;
LAB_00131582:
  JVar12.u.ptr = (void *)(uVar5 | uVar8);
  JVar12.tag = uVar10;
  return JVar12;
}

Assistant:

static JSValue js_promise_constructor(JSContext *ctx, JSValueConst new_target,
                                      int argc, JSValueConst *argv)
{
    JSValueConst executor;
    JSValue obj;
    JSPromiseData *s;
    JSValue args[2], ret;
    int i;

    executor = argv[0];
    if (check_function(ctx, executor))
        return JS_EXCEPTION;
    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_PROMISE);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        goto fail;
    s->promise_state = JS_PROMISE_PENDING;
    s->is_handled = FALSE;
    for(i = 0; i < 2; i++)
        init_list_head(&s->promise_reactions[i]);
    s->promise_result = JS_UNDEFINED;
    JS_SetOpaque(obj, s);
    if (js_create_resolving_functions(ctx, args, obj))
        goto fail;
    ret = JS_Call(ctx, executor, JS_UNDEFINED, 2, (JSValueConst *)args);
    if (JS_IsException(ret)) {
        JSValue ret2, error;
        error = JS_GetException(ctx);
        ret2 = JS_Call(ctx, args[1], JS_UNDEFINED, 1, (JSValueConst *)&error);
        JS_FreeValue(ctx, error);
        if (JS_IsException(ret2))
            goto fail1;
        JS_FreeValue(ctx, ret2);
    }
    JS_FreeValue(ctx, ret);
    JS_FreeValue(ctx, args[0]);
    JS_FreeValue(ctx, args[1]);
    return obj;
 fail1:
    JS_FreeValue(ctx, args[0]);
    JS_FreeValue(ctx, args[1]);
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}